

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

bool tinyusdz::tydra::(anonymous_namespace)::TriangulatePolygon<std::array<float,3ul>,float>
               (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *points,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *triangulatedFaceVertexCounts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *triangulatedFaceVertexIndices,
               vector<unsigned_long,_std::allocator<unsigned_long>_>
               *triangulatedToOrigFaceVertexIndexMap,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *triangulatedFaceCounts,
               string *err)

{
  pointer pcVar1;
  uint uVar2;
  pointer puVar3;
  pointer paVar4;
  iterator iVar5;
  undefined1 auVar6 [16];
  double dVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  char *pcVar10;
  uint *puVar11;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  *extraout_RDX;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  *extraout_RDX_00;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  *poly;
  char *pcVar12;
  ulong uVar13;
  iterator iVar14;
  ulong uVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar16;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar17;
  ulong uVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar25;
  float3 fVar26;
  uint32_t npolys;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  polygon_2d;
  double3 n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  array<float,_3UL> axis_w;
  pointer local_138;
  undefined1 local_128 [8];
  iterator iStack_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  pointer local_108;
  uint local_fc;
  undefined1 local_f8 [8];
  pointer pvStack_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_c8;
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_b0;
  float3 local_a0;
  float local_94;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *local_78;
  float3 local_70;
  float3 local_64;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  pointer puVar9;
  
  puVar9 = (triangulatedFaceVertexCounts->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((triangulatedFaceVertexCounts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      )._M_impl.super__Vector_impl_data._M_finish != puVar9) {
    (triangulatedFaceVertexCounts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish = puVar9;
  }
  puVar9 = (triangulatedFaceVertexIndices->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((triangulatedFaceVertexIndices->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar9) {
    (triangulatedFaceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
    ._M_impl.super__Vector_impl_data._M_finish = puVar9;
  }
  puVar3 = (triangulatedToOrigFaceVertexIndexMap->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((triangulatedToOrigFaceVertexIndexMap->
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (triangulatedToOrigFaceVertexIndexMap->
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  local_c0._0_8_ = (pointer)0x0;
  puVar9 = (faceVertexCounts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_start;
  bVar21 = (faceVertexCounts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_finish == puVar9;
  if (!bVar21) {
    local_138 = (pointer)0x0;
    pvVar17 = triangulatedFaceVertexIndices;
    local_d0 = triangulatedFaceVertexCounts;
    local_c8 = faceVertexCounts;
    local_78 = points;
    do {
      local_fc = puVar9[local_c0._0_8_];
      pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)local_fc;
      if (pvVar8 < (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3) {
        local_f8 = (undefined1  [8])&local_e8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f8,
                   "faceVertex count must be 3(triangle) or more(polygon), but got faceVertexCounts[{}] = {}\n"
                   ,"");
        fmt::format<unsigned_long,unsigned_int>
                  ((string *)local_128,(fmt *)local_f8,(string *)local_c0,(unsigned_long *)&local_fc
                   ,(uint *)pvVar17);
LAB_0034e679:
        ::std::__cxx11::string::operator=((string *)err,(string *)local_128);
        if (local_128 != (undefined1  [8])&local_118) {
          operator_delete((void *)local_128,(ulong)(local_118._M_allocated_capacity + 1));
        }
        if (local_f8 != (undefined1  [8])&local_e8) {
          operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
        }
LAB_0034e6c1:
        bVar20 = false;
      }
      else {
        puVar9 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((pointer)((long)(faceVertexIndices->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar9 >> 2) <
            local_138 + (long)pvVar8) {
          local_f8 = (undefined1  [8])&local_e8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_f8,
                     "Invalid faceVertexIndices or faceVertexCounts. faceVertex index exceeds faceVertexIndices.size() at [{}]\n"
                     ,"");
          fmt::format<unsigned_long>
                    ((string *)local_128,(string *)local_f8,(unsigned_long *)local_c0);
          goto LAB_0034e679;
        }
        if (pvVar8 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x4) {
          if (local_fc == 3) {
            local_128._0_4_ = 3;
            iVar14._M_current =
                 (local_d0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                (local_d0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(local_d0,iVar14,(uint *)local_128);
            }
            else {
              *iVar14._M_current = 3;
              (local_d0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar14._M_current + 1;
            }
            puVar11 = (faceVertexIndices->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_start + (long)local_138;
            iVar14._M_current =
                 (triangulatedFaceVertexIndices->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                (triangulatedFaceVertexIndices->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                         triangulatedFaceVertexIndices,iVar14,puVar11);
            }
            else {
              *iVar14._M_current = *puVar11;
              (triangulatedFaceVertexIndices->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar14._M_current + 1;
            }
            puVar11 = (faceVertexIndices->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_start + (long)(local_138 + 1);
            iVar14._M_current =
                 (triangulatedFaceVertexIndices->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                (triangulatedFaceVertexIndices->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                         triangulatedFaceVertexIndices,iVar14,puVar11);
            }
            else {
              *iVar14._M_current = *puVar11;
              (triangulatedFaceVertexIndices->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar14._M_current + 1;
            }
            puVar11 = (faceVertexIndices->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_start + (long)(local_138 + 2);
            iVar14._M_current =
                 (triangulatedFaceVertexIndices->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                (triangulatedFaceVertexIndices->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                         triangulatedFaceVertexIndices,iVar14,puVar11);
            }
            else {
              *iVar14._M_current = *puVar11;
              (triangulatedFaceVertexIndices->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar14._M_current + 1;
            }
            local_128 = (undefined1  [8])local_138;
            iVar5._M_current =
                 (triangulatedToOrigFaceVertexIndexMap->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (triangulatedToOrigFaceVertexIndexMap->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>
                        (triangulatedToOrigFaceVertexIndexMap,iVar5,(unsigned_long *)local_128);
            }
            else {
              *iVar5._M_current = (unsigned_long)local_138;
              (triangulatedToOrigFaceVertexIndexMap->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            }
            local_128 = (undefined1  [8])(local_138 + 1);
            iVar5._M_current =
                 (triangulatedToOrigFaceVertexIndexMap->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (triangulatedToOrigFaceVertexIndexMap->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>
                        (triangulatedToOrigFaceVertexIndexMap,iVar5,(unsigned_long *)local_128);
            }
            else {
              *iVar5._M_current = (unsigned_long)local_128;
              (triangulatedToOrigFaceVertexIndexMap->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            }
            local_128 = (undefined1  [8])(local_138 + 2);
            iVar5._M_current =
                 (triangulatedToOrigFaceVertexIndexMap->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (triangulatedToOrigFaceVertexIndexMap->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>
                        (triangulatedToOrigFaceVertexIndexMap,iVar5,(unsigned_long *)local_128);
            }
            else {
              *iVar5._M_current = (unsigned_long)local_128;
              (triangulatedToOrigFaceVertexIndexMap->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            }
            local_128._0_4_ = 1;
            iVar14._M_current =
                 (triangulatedFaceCounts->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current !=
                (triangulatedFaceCounts->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *iVar14._M_current = 1;
              goto LAB_0034eda8;
            }
            goto LAB_0034edb2;
          }
          local_c0._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          aStack_b0._M_allocated_capacity = 0;
          aStack_b0._8_8_ = (array<float,_2UL> *)0x0;
          paVar4 = (local_78->
                   super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar13 = ((long)(local_78->
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)paVar4 >> 2) *
                   -0x5555555555555555;
          bVar20 = true;
          pvVar16 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1;
          do {
            uVar15 = (ulong)puVar9[(long)(local_138 +
                                         (long)((long)&pvVar16[-1].
                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data + 0x17))];
            pvVar17 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            if (pvVar16 != pvVar8) {
              pvVar17 = pvVar16;
            }
            if ((uVar13 < uVar15 || uVar13 - uVar15 == 0) ||
               (uVar18 = (ulong)puVar9[(long)(local_138 + (long)pvVar17)],
               uVar13 < uVar18 || uVar13 - uVar18 == 0)) {
              local_f8 = (undefined1  [8])&local_e8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_f8,"Invalid vertex index.\n","");
              fmt::format((string *)local_128,(string *)local_f8);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_128);
              pvVar17 = pvVar16;
              if (local_128 != (undefined1  [8])&local_118) {
                operator_delete((void *)local_128,(ulong)(local_118._M_allocated_capacity + 1));
                pvVar17 = pvVar16;
              }
              if (local_f8 != (undefined1  [8])&local_e8) {
                operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
              }
              if (bVar20) goto LAB_0034e981;
              break;
            }
            local_c0._8_8_ =
                 (double)local_c0._8_8_ +
                 (double)((paVar4[uVar15]._M_elems[2] + paVar4[uVar18]._M_elems[2]) *
                         (paVar4[uVar15]._M_elems[1] - paVar4[uVar18]._M_elems[1]));
            aStack_b0._M_allocated_capacity =
                 (size_type)
                 (aStack_b0._M_allocated_capacity +
                 (double)((paVar4[uVar15]._M_elems[0] + paVar4[uVar18]._M_elems[0]) *
                         (paVar4[uVar15]._M_elems[2] - paVar4[uVar18]._M_elems[2])));
            aStack_b0._8_8_ =
                 (size_type)
                 (aStack_b0._8_8_ +
                 (double)((paVar4[uVar15]._M_elems[1] + paVar4[uVar18]._M_elems[1]) *
                         (paVar4[uVar15]._M_elems[0] - paVar4[uVar18]._M_elems[0])));
            bVar20 = pvVar16 < pvVar8;
            pvVar17 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      ((long)&(pvVar16->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + 1);
            bVar22 = pvVar16 != pvVar8;
            pvVar16 = pvVar17;
          } while (bVar22);
          dVar7 = vlength((double3 *)(local_c0 + 8));
          if (ABS(dVar7) < 2.220446049250313e-16) {
            pvVar17 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1b;
            ::std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x6123c2);
LAB_0034e981:
            bVar20 = false;
            faceVertexCounts = local_c8;
            goto LAB_0034e6c3;
          }
          vnormalize((double3 *)local_128,(double3 *)(local_c0 + 8),2.220446049250313e-16);
          aStack_b0._8_8_ = local_118._M_allocated_capacity;
          local_c0._8_8_ = local_128;
          aStack_b0._M_allocated_capacity = (size_type)iStack_120._M_current;
          local_64._M_elems[0] = (float)(double)local_128;
          local_64._M_elems[1] = (float)(double)iStack_120._M_current;
          local_64._M_elems[2] = (float)(double)local_118._M_allocated_capacity;
          if (ABS(local_64._M_elems[0]) <= 0.9999999) {
            local_70._M_elems[0] = 1.0;
            local_70._M_elems[1] = 0.0;
          }
          else {
            local_70._M_elems[0] = 0.0;
            local_70._M_elems[1] = 1.0;
          }
          local_70._M_elems[2] = 0.0;
          fVar26 = vcross(&local_64,&local_70);
          local_128 = fVar26._M_elems._0_8_;
          iStack_120._M_current._0_4_ = fVar26._M_elems[2];
          fVar26 = vnormalize((float3 *)local_128,1.1920929e-07);
          local_a0._M_elems[2] = fVar26._M_elems[2];
          local_a0._M_elems._0_8_ = fVar26._M_elems._0_8_;
          fVar26 = vcross(&local_64,&local_a0);
          fVar25 = fVar26._M_elems[2];
          fVar23 = fVar26._M_elems[0];
          fVar24 = fVar26._M_elems[1];
          local_128 = (undefined1  [8])0x0;
          iStack_120._M_current = (array<float,_2UL> *)0x0;
          local_118._M_allocated_capacity = 0;
          poly = extraout_RDX;
          if (local_fc != 0) {
            uVar13 = 0;
            local_58._8_4_ = extraout_XMM0_Dc;
            local_58._0_8_ = fVar26._M_elems._0_8_;
            local_58._12_4_ = extraout_XMM0_Dd;
            local_94 = fVar25;
            local_48 = fVar24;
            fStack_44 = fVar24;
            fStack_40 = fVar24;
            fStack_3c = fVar24;
            do {
              uVar2 = (faceVertexIndices->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_start[(long)(local_138 + uVar13)];
              paVar4 = (local_78->
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_f8._4_4_ =
                   paVar4[uVar2]._M_elems[2] * local_a0._M_elems[2] +
                   paVar4[uVar2]._M_elems[0] * local_a0._M_elems[0] +
                   paVar4[uVar2]._M_elems[1] * local_a0._M_elems[1];
              local_f8._0_4_ =
                   paVar4[uVar2]._M_elems[2] * fVar25 +
                   paVar4[uVar2]._M_elems[0] * fVar23 + fVar24 * paVar4[uVar2]._M_elems[1];
              if (iStack_120._M_current == (array<float,_2UL> *)local_118._M_allocated_capacity) {
                ::std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>::
                _M_realloc_insert<std::array<float,2ul>>
                          ((vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *)
                           local_128,iStack_120,(array<float,_2UL> *)local_f8);
                poly = extraout_RDX_00;
                fVar23 = (float)local_58._0_4_;
                fVar24 = local_48;
                fVar25 = local_94;
              }
              else {
                *(undefined1 (*) [8])(iStack_120._M_current)->_M_elems = local_f8;
                iStack_120._M_current = iStack_120._M_current + 1;
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < local_fc);
          }
          local_f8._0_4_ = 0.0;
          local_f8._4_4_ = 0.0;
          pvStack_f0 = (pointer)0x0;
          local_e8._M_allocated_capacity = 0;
          mapbox::
          earcut<unsigned_int,std::vector<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>,std::allocator<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>>>
                    (&local_90,(mapbox *)local_f8,poly);
          uVar13 = (long)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar13;
          if (SUB168(auVar6 * ZEXT816(0xaaaaaaaaaaaaaaab),0) < 0x5555555555555556) {
            if (2 < uVar13 >> 0x1f) {
              pcVar12 = (char *)err->_M_string_length;
              pvVar17 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x22;
              pcVar10 = "Too many triangles are generated.\n";
              goto LAB_0034f08e;
            }
            uVar15 = uVar13 / 3;
            local_58._0_8_ = uVar15;
            if (2 < uVar13) {
              lVar19 = 0;
              pvVar8 = local_d0;
              do {
                local_108 = (pointer)CONCAT44(local_108._4_4_,3);
                iVar14._M_current =
                     (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar14._M_current ==
                    (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  _M_realloc_insert<unsigned_int>(pvVar8,iVar14,(uint *)&local_108);
                }
                else {
                  *iVar14._M_current = 3;
                  (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar14._M_current + 1;
                }
                puVar11 = (faceVertexIndices->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_start +
                          (long)(local_138 +
                                *(uint *)((long)local_90.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start + lVar19))
                ;
                iVar14._M_current =
                     (triangulatedFaceVertexIndices->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar14._M_current ==
                    (triangulatedFaceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                             triangulatedFaceVertexIndices,iVar14,puVar11);
                }
                else {
                  *iVar14._M_current = *puVar11;
                  (triangulatedFaceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar14._M_current + 1;
                }
                puVar11 = (faceVertexIndices->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_start +
                          (long)(local_138 +
                                *(uint *)((long)local_90.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                         lVar19 + 4));
                iVar14._M_current =
                     (triangulatedFaceVertexIndices->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar14._M_current ==
                    (triangulatedFaceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                             triangulatedFaceVertexIndices,iVar14,puVar11);
                }
                else {
                  *iVar14._M_current = *puVar11;
                  (triangulatedFaceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar14._M_current + 1;
                }
                puVar11 = (faceVertexIndices->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_start +
                          (long)(local_138 +
                                *(uint *)((long)local_90.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                         lVar19 + 8));
                iVar14._M_current =
                     (triangulatedFaceVertexIndices->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar14._M_current ==
                    (triangulatedFaceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                             triangulatedFaceVertexIndices,iVar14,puVar11);
                }
                else {
                  *iVar14._M_current = *puVar11;
                  (triangulatedFaceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar14._M_current + 1;
                }
                pvVar8 = local_d0;
                local_108 = local_138 +
                            *(uint *)((long)local_90.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar19);
                iVar5._M_current =
                     (triangulatedToOrigFaceVertexIndexMap->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (triangulatedToOrigFaceVertexIndexMap->
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<unsigned_long>
                            (triangulatedToOrigFaceVertexIndexMap,iVar5,(unsigned_long *)&local_108)
                  ;
                }
                else {
                  *iVar5._M_current = (unsigned_long)local_108;
                  (triangulatedToOrigFaceVertexIndexMap->
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar5._M_current + 1;
                }
                local_108 = local_138 +
                            *(uint *)((long)local_90.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar19 + 4);
                iVar5._M_current =
                     (triangulatedToOrigFaceVertexIndexMap->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (triangulatedToOrigFaceVertexIndexMap->
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<unsigned_long>
                            (triangulatedToOrigFaceVertexIndexMap,iVar5,(unsigned_long *)&local_108)
                  ;
                }
                else {
                  *iVar5._M_current = (unsigned_long)local_108;
                  (triangulatedToOrigFaceVertexIndexMap->
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar5._M_current + 1;
                }
                local_108 = local_138 +
                            *(uint *)((long)local_90.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar19 + 8);
                iVar5._M_current =
                     (triangulatedToOrigFaceVertexIndexMap->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (triangulatedToOrigFaceVertexIndexMap->
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<unsigned_long>
                            (triangulatedToOrigFaceVertexIndexMap,iVar5,(unsigned_long *)&local_108)
                  ;
                }
                else {
                  *iVar5._M_current = (unsigned_long)local_108;
                  (triangulatedToOrigFaceVertexIndexMap->
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar5._M_current + 1;
                }
                lVar19 = lVar19 + 0xc;
                uVar15 = uVar15 - 1;
              } while (uVar15 != 0);
            }
            local_108 = (pointer)CONCAT44(local_108._4_4_,local_58._0_4_);
            iVar14._M_current =
                 (triangulatedFaceCounts->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                (triangulatedFaceCounts->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(triangulatedFaceCounts,iVar14,(uint *)&local_108);
            }
            else {
              *iVar14._M_current = local_58._0_4_;
              (triangulatedFaceCounts->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar14._M_current + 1;
            }
            bVar20 = true;
          }
          else {
            pcVar12 = (char *)err->_M_string_length;
            pvVar17 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x17;
            pcVar10 = "Failed to triangulate.\n";
LAB_0034f08e:
            bVar20 = false;
            ::std::__cxx11::string::_M_replace((ulong)err,0,pcVar12,(ulong)pcVar10);
          }
          if (local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_90.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_90.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          ::std::
          vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
          ::~vector((vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
                     *)local_f8);
          if (local_128 != (undefined1  [8])0x0) {
            operator_delete((void *)local_128,local_118._M_allocated_capacity - (long)local_128);
          }
          faceVertexCounts = local_c8;
          if (bVar20) goto LAB_0034edc0;
          goto LAB_0034e6c1;
        }
        local_128._0_4_ = 4.2039e-45;
        iVar14._M_current =
             (local_d0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar14._M_current ==
            (local_d0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
          _M_realloc_insert<unsigned_int>(local_d0,iVar14,(uint *)local_128);
        }
        else {
          *iVar14._M_current = 3;
          (local_d0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar14._M_current + 1;
        }
        local_128._0_4_ = 3;
        iVar14._M_current =
             (local_d0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar14._M_current ==
            (local_d0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
          _M_realloc_insert<unsigned_int>(local_d0,iVar14,(uint *)local_128);
        }
        else {
          *iVar14._M_current = 3;
          (local_d0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar14._M_current + 1;
        }
        puVar11 = (faceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start + (long)local_138;
        iVar14._M_current =
             (triangulatedFaceVertexIndices->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar14._M_current ==
            (triangulatedFaceVertexIndices->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     triangulatedFaceVertexIndices,iVar14,puVar11);
        }
        else {
          *iVar14._M_current = *puVar11;
          (triangulatedFaceVertexIndices->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar14._M_current + 1;
        }
        puVar11 = (faceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start + (long)(local_138 + 1);
        iVar14._M_current =
             (triangulatedFaceVertexIndices->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar14._M_current ==
            (triangulatedFaceVertexIndices->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     triangulatedFaceVertexIndices,iVar14,puVar11);
        }
        else {
          *iVar14._M_current = *puVar11;
          (triangulatedFaceVertexIndices->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar14._M_current + 1;
        }
        puVar11 = (faceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start + (long)(local_138 + 2);
        iVar14._M_current =
             (triangulatedFaceVertexIndices->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar14._M_current ==
            (triangulatedFaceVertexIndices->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     triangulatedFaceVertexIndices,iVar14,puVar11);
        }
        else {
          *iVar14._M_current = *puVar11;
          (triangulatedFaceVertexIndices->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar14._M_current + 1;
        }
        puVar11 = (faceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start + (long)local_138;
        iVar14._M_current =
             (triangulatedFaceVertexIndices->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar14._M_current ==
            (triangulatedFaceVertexIndices->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     triangulatedFaceVertexIndices,iVar14,puVar11);
        }
        else {
          *iVar14._M_current = *puVar11;
          (triangulatedFaceVertexIndices->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar14._M_current + 1;
        }
        pcVar1 = local_138 + 2;
        puVar11 = (faceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start + (long)pcVar1;
        iVar14._M_current =
             (triangulatedFaceVertexIndices->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar14._M_current ==
            (triangulatedFaceVertexIndices->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     triangulatedFaceVertexIndices,iVar14,puVar11);
        }
        else {
          *iVar14._M_current = *puVar11;
          (triangulatedFaceVertexIndices->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar14._M_current + 1;
        }
        puVar11 = (faceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start + (long)(local_138 + 3);
        iVar14._M_current =
             (triangulatedFaceVertexIndices->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar14._M_current ==
            (triangulatedFaceVertexIndices->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     triangulatedFaceVertexIndices,iVar14,puVar11);
        }
        else {
          *iVar14._M_current = *puVar11;
          (triangulatedFaceVertexIndices->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar14._M_current + 1;
        }
        local_128 = (undefined1  [8])local_138;
        iVar5._M_current =
             (triangulatedToOrigFaceVertexIndexMap->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (triangulatedToOrigFaceVertexIndexMap->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (triangulatedToOrigFaceVertexIndexMap,iVar5,(unsigned_long *)local_128);
        }
        else {
          *iVar5._M_current = (unsigned_long)local_138;
          (triangulatedToOrigFaceVertexIndexMap->
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        local_128 = (undefined1  [8])(local_138 + 1);
        iVar5._M_current =
             (triangulatedToOrigFaceVertexIndexMap->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (triangulatedToOrigFaceVertexIndexMap->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (triangulatedToOrigFaceVertexIndexMap,iVar5,(unsigned_long *)local_128);
        }
        else {
          *iVar5._M_current = (unsigned_long)local_128;
          (triangulatedToOrigFaceVertexIndexMap->
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        iVar5._M_current =
             (triangulatedToOrigFaceVertexIndexMap->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (triangulatedToOrigFaceVertexIndexMap->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_128 = (undefined1  [8])pcVar1;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (triangulatedToOrigFaceVertexIndexMap,iVar5,(unsigned_long *)local_128);
        }
        else {
          *iVar5._M_current = (unsigned_long)pcVar1;
          (triangulatedToOrigFaceVertexIndexMap->
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        local_128 = (undefined1  [8])local_138;
        iVar5._M_current =
             (triangulatedToOrigFaceVertexIndexMap->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (triangulatedToOrigFaceVertexIndexMap->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (triangulatedToOrigFaceVertexIndexMap,iVar5,(unsigned_long *)local_128);
        }
        else {
          *iVar5._M_current = (unsigned_long)local_138;
          (triangulatedToOrigFaceVertexIndexMap->
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        iVar5._M_current =
             (triangulatedToOrigFaceVertexIndexMap->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (triangulatedToOrigFaceVertexIndexMap->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_128 = (undefined1  [8])pcVar1;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (triangulatedToOrigFaceVertexIndexMap,iVar5,(unsigned_long *)local_128);
        }
        else {
          *iVar5._M_current = (unsigned_long)pcVar1;
          (triangulatedToOrigFaceVertexIndexMap->
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        faceVertexCounts = local_c8;
        local_128 = (undefined1  [8])(local_138 + 3);
        iVar5._M_current =
             (triangulatedToOrigFaceVertexIndexMap->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (triangulatedToOrigFaceVertexIndexMap->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (triangulatedToOrigFaceVertexIndexMap,iVar5,(unsigned_long *)local_128);
        }
        else {
          *iVar5._M_current = (unsigned_long)local_128;
          (triangulatedToOrigFaceVertexIndexMap->
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        local_128._0_4_ = 2;
        iVar14._M_current =
             (triangulatedFaceCounts->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar14._M_current ==
            (triangulatedFaceCounts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_0034edb2:
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
          _M_realloc_insert<unsigned_int>(triangulatedFaceCounts,iVar14,(uint *)local_128);
        }
        else {
          *iVar14._M_current = 2;
LAB_0034eda8:
          (triangulatedFaceCounts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar14._M_current + 1;
        }
LAB_0034edc0:
        local_138 = local_138 + local_fc;
        bVar20 = true;
      }
LAB_0034e6c3:
      if (!bVar20) {
        return bVar21;
      }
      local_c0._0_8_ = local_c0._0_8_ + 1;
      puVar9 = (faceVertexCounts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      bVar20 = (ulong)local_c0._0_8_ <
               (pointer)((long)(faceVertexCounts->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 2);
      bVar21 = !bVar20;
    } while (bVar20);
  }
  return bVar21;
}

Assistant:

bool TriangulatePolygon(
    const std::vector<T> &points, const std::vector<uint32_t> &faceVertexCounts,
    const std::vector<uint32_t> &faceVertexIndices,
    std::vector<uint32_t> &triangulatedFaceVertexCounts,
    std::vector<uint32_t> &triangulatedFaceVertexIndices,
    std::vector<size_t> &triangulatedToOrigFaceVertexIndexMap,
    std::vector<uint32_t> &triangulatedFaceCounts, std::string &err) {
  triangulatedFaceVertexCounts.clear();
  triangulatedFaceVertexIndices.clear();

  triangulatedToOrigFaceVertexIndexMap.clear();

  size_t faceIndexOffset = 0;

  // For each polygon(face)
  for (size_t i = 0; i < faceVertexCounts.size(); i++) {
    uint32_t npolys = faceVertexCounts[i];

    if (npolys < 3) {
      err = fmt::format(
          "faceVertex count must be 3(triangle) or "
          "more(polygon), but got faceVertexCounts[{}] = {}\n",
          i, npolys);
      return false;
    }

    if (faceIndexOffset + npolys > faceVertexIndices.size()) {
      err = fmt::format(
          "Invalid faceVertexIndices or faceVertexCounts. faceVertex index "
          "exceeds faceVertexIndices.size() at [{}]\n",
          i);
      return false;
    }

    if (npolys == 3) {
      // No need for triangulation.
      triangulatedFaceVertexCounts.push_back(3);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 0]);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 1]);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 2]);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 0);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 1);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 2);
      triangulatedFaceCounts.push_back(1);
#if 1
    } else if (npolys == 4) {
      // Use simple split
      // TODO: Split at shortest edge for better triangulation.
      triangulatedFaceVertexCounts.push_back(3);
      triangulatedFaceVertexCounts.push_back(3);

      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 0]);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 1]);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 2]);

      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 0]);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 2]);
      triangulatedFaceVertexIndices.push_back(
          faceVertexIndices[faceIndexOffset + 3]);

      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 0);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 1);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 2);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 0);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 2);
      triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset + 3);
      triangulatedFaceCounts.push_back(2);
#endif
    } else {
      // Use double for accuracy. `float` precision may classify small-are polygon as degenerated.
      // Find the normal axis of the polygon using Newell's method
      value::double3 n = {0, 0, 0};

      size_t vi0;
      size_t vi0_2;

      for (size_t k = 0; k < npolys; ++k) {
        vi0 = faceVertexIndices[faceIndexOffset + k];

        size_t j = (k + 1) % npolys;
        vi0_2 = faceVertexIndices[faceIndexOffset + j];

        if (vi0 >= points.size()) {
          err = fmt::format("Invalid vertex index.\n");
          return false;
        }

        if (vi0_2 >= points.size()) {
          err = fmt::format("Invalid vertex index.\n");
          return false;
        }

        T v0 = points[vi0];
        T v1 = points[vi0_2];

        const T point1 = {v0[0], v0[1], v0[2]};
        const T point2 = {v1[0], v1[1], v1[2]};

        T a = {point1[0] - point2[0], point1[1] - point2[1],
               point1[2] - point2[2]};
        T b = {point1[0] + point2[0], point1[1] + point2[1],
               point1[2] + point2[2]};

        n[0] += double(a[1] * b[2]);
        n[1] += double(a[2] * b[0]);
        n[2] += double(a[0] * b[1]);
        DCOUT("v0 " << v0);
        DCOUT("v1 " << v1);
        DCOUT("n " << n);
      }
      //BaseTy length_n = vlength(n);
      double length_n = vlength(n);

      // Check if zero length normal
      if (std::fabs(length_n) < std::numeric_limits<double>::epsilon()) {
        DCOUT("length_n " << length_n);
        err = "Degenerated polygon found.\n";
        return false;
      }

      // Negative is to flip the normal to the correct direction
      n = vnormalize(n);

      T axis_w, axis_v, axis_u;
      axis_w[0] = BaseTy(n[0]);
      axis_w[1] = BaseTy(n[1]);
      axis_w[2] = BaseTy(n[2]);
      T a;
      if (std::fabs(axis_w[0]) > BaseTy(0.9999999)) {  // TODO: use 1.0 - eps?
        a = {BaseTy(0), BaseTy(1), BaseTy(0)};
      } else {
        a = {BaseTy(1), BaseTy(0), BaseTy(0)};
      }
      axis_v = vnormalize(vcross(axis_w, a));
      axis_u = vcross(axis_w, axis_v);

      using Point3D = std::array<BaseTy, 3>;
      using Point2D = std::array<BaseTy, 2>;
      std::vector<Point2D> polyline;

      // TMW change: Find best normal and project v0x and v0y to those
      // coordinates, instead of picking a plane aligned with an axis (which
      // can flip polygons).

      // Fill polygon data.
      for (size_t k = 0; k < npolys; k++) {
        size_t vidx = faceVertexIndices[faceIndexOffset + k];

        value::float3 v = points[vidx];
        // Point3 polypoint = {v0[0],v0[1],v0[2]};

        // world to local
        Point3D loc = {vdot(v, axis_u), vdot(v, axis_v), vdot(v, axis_w)};

        polyline.push_back({loc[0], loc[1]});
      }

      std::vector<std::vector<Point2D>> polygon_2d;
      // Single polygon only(no holes)

      std::vector<uint32_t> indices = mapbox::earcut<uint32_t>(polygon_2d);
      //  => result = 3 * faces, clockwise

      if ((indices.size() % 3) != 0) {
        // This should not be happen, though.
        err = "Failed to triangulate.\n";
        return false;
      }

      size_t ntris = indices.size() / 3;

      // Up to 2GB tris.
      if (ntris > size_t((std::numeric_limits<int32_t>::max)())) {
        err = "Too many triangles are generated.\n";
        return false;
      }

      for (size_t k = 0; k < ntris; k++) {
        triangulatedFaceVertexCounts.push_back(3);
        triangulatedFaceVertexIndices.push_back(
            faceVertexIndices[faceIndexOffset + indices[3 * k + 0]]);
        triangulatedFaceVertexIndices.push_back(
            faceVertexIndices[faceIndexOffset + indices[3 * k + 1]]);
        triangulatedFaceVertexIndices.push_back(
            faceVertexIndices[faceIndexOffset + indices[3 * k + 2]]);

        triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset +
                                                       indices[3 * k + 0]);
        triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset +
                                                       indices[3 * k + 1]);
        triangulatedToOrigFaceVertexIndexMap.push_back(faceIndexOffset +
                                                       indices[3 * k + 2]);
      }
      triangulatedFaceCounts.push_back(uint32_t(ntris));
    }

    faceIndexOffset += npolys;
  }

  return true;
}